

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fBasicComputeShaderTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_2::CopySSBOToImageCase::iterate(CopySSBOToImageCase *this)

{
  uint *puVar1;
  size_type *psVar2;
  RenderContext *renderCtx;
  ContextType type;
  GLSLVersion version;
  int iVar3;
  deUint32 dVar4;
  GLuint GVar5;
  GLenum GVar6;
  char *pcVar7;
  ostream *poVar8;
  undefined4 extraout_var;
  ProgramSources *sources;
  TestError *pTVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  pointer puVar13;
  allocator<char> local_4f9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> inputValues;
  uint local_4dc;
  IVec2 workSize;
  BufferMemMap bufMap;
  Texture outputTexture;
  vector<unsigned_int,_std::allocator<unsigned_int>_> pixels;
  Buffer inputBuffer;
  Framebuffer fbo;
  InterfaceBlockInfo blockInfo;
  Random rnd;
  ShaderProgram program;
  InterfaceVariableInfo valueInfo;
  ostringstream src;
  Functions *gl;
  
  type.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion(type);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar7 = glu::getGLSLVersionDeclaration(version);
  poVar8 = std::operator<<((ostream *)&src,pcVar7);
  poVar8 = std::operator<<(poVar8,"\n");
  poVar8 = std::operator<<(poVar8,"layout (local_size_x = ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(this->m_localSize).m_data[0]);
  poVar8 = std::operator<<(poVar8,", local_size_y = ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(this->m_localSize).m_data[1]);
  poVar8 = std::operator<<(poVar8,") in;\n");
  poVar8 = std::operator<<(poVar8,
                           "layout(r32ui, binding = 1) writeonly uniform highp uimage2D u_dstImg;\n"
                          );
  poVar8 = std::operator<<(poVar8,"buffer Input {\n");
  poVar8 = std::operator<<(poVar8,"    uint values[");
  poVar8 = (ostream *)
           std::ostream::operator<<
                     (poVar8,(this->m_imageSize).m_data[1] * (this->m_imageSize).m_data[0]);
  poVar8 = std::operator<<(poVar8,"];\n");
  poVar8 = std::operator<<(poVar8,"} sb_in;\n\n");
  poVar8 = std::operator<<(poVar8,"void main (void) {\n");
  poVar8 = std::operator<<(poVar8,"    uint stride = gl_NumWorkGroups.x*gl_WorkGroupSize.x;\n");
  poVar8 = std::operator<<(poVar8,
                           "    uint value  = sb_in.values[gl_GlobalInvocationID.y*stride + gl_GlobalInvocationID.x];\n"
                          );
  poVar8 = std::operator<<(poVar8,
                           "    imageStore(u_dstImg, ivec2(gl_GlobalInvocationID.xy), uvec4(value, 0, 0, 0));\n"
                          );
  std::operator<<(poVar8,"}\n");
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar3);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            (&inputBuffer,((this->super_TestCase).m_context)->m_renderCtx);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
            (&outputTexture,((this->super_TestCase).m_context)->m_renderCtx);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(&valueInfo,0,0xac);
  std::__cxx11::stringbuf::str();
  psVar2 = &blockInfo.name._M_string_length;
  blockInfo.name._M_dataplus._M_p._0_4_ = 5;
  std::__cxx11::string::string((string *)psVar2,(string *)&bufMap);
  sources = glu::ProgramSources::operator<<((ProgramSources *)&valueInfo,(ShaderSource *)&blockInfo)
  ;
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,sources);
  std::__cxx11::string::~string((string *)psVar2);
  std::__cxx11::string::~string((string *)&bufMap);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&valueInfo);
  tcu::operator/((tcu *)&workSize,&this->m_imageSize,&this->m_localSize);
  deRandom_init(&rnd.m_rnd,0x77238ac2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&inputValues,(long)((this->m_imageSize).m_data[1] * (this->m_imageSize).m_data[0]),
             (allocator_type *)&valueInfo);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,&program);
  if (program.m_program.m_info.linkOk == false) {
    pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar9,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
               ,0x47e);
    __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  valueInfo.name._M_dataplus._M_p =
       (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  psVar2 = &valueInfo.name._M_string_length;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)psVar2);
  std::operator<<((ostream *)psVar2,"Work groups: ");
  tcu::operator<<((ostream *)psVar2,&workSize);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&valueInfo,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)psVar2);
  (*gl->useProgram)(program.m_program.m_program);
  for (puVar13 = inputValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                 .super__Vector_impl_data._M_start;
      puVar13 !=
      inputValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish; puVar13 = puVar13 + 1) {
    dVar4 = deRandom_getUint32(&rnd.m_rnd);
    *puVar13 = dVar4;
  }
  GVar5 = (*gl->getProgramResourceIndex)(program.m_program.m_program,0x92e6,"Input");
  glu::getProgramInterfaceBlockInfo(&blockInfo,gl,program.m_program.m_program,0x92e6,GVar5);
  GVar5 = (*gl->getProgramResourceIndex)(program.m_program.m_program,0x92e5,"Input.values");
  glu::getProgramInterfaceVariableInfo(&valueInfo,gl,program.m_program.m_program,0x92e5,GVar5);
  (*gl->bindBuffer)(0x90d2,inputBuffer.super_ObjectWrapper.m_object);
  (*gl->bufferData)(0x90d2,(ulong)blockInfo.dataSize,(void *)0x0,0x88e4);
  if (valueInfo.arraySize ==
      (deUint32)
      ((ulong)((long)inputValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)inputValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start) >> 2)) {
    BufferMemMap::BufferMemMap(&bufMap,gl,0x90d2,0,blockInfo.dataSize,2);
    for (uVar10 = 0;
        ((ulong)((long)inputValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)inputValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start) >> 2 & 0xffffffff) != uVar10;
        uVar10 = uVar10 + 1) {
      *(uint *)((long)bufMap.m_ptr +
               (ulong)(uint)(valueInfo.arrayStride * (int)uVar10) + (ulong)valueInfo.offset) =
           inputValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start[uVar10];
    }
    BufferMemMap::~BufferMemMap(&bufMap);
    (*gl->bindBufferBase)(0x90d2,blockInfo.bufferBinding,inputBuffer.super_ObjectWrapper.m_object);
    GVar6 = (*gl->getError)();
    glu::checkError(GVar6,"Input buffer setup failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                    ,0x49c);
    std::__cxx11::string::~string((string *)&valueInfo);
    glu::InterfaceBlockInfo::~InterfaceBlockInfo(&blockInfo);
    (*gl->bindTexture)(0xde1,outputTexture.super_ObjectWrapper.m_object);
    (*gl->texStorage2D)(0xde1,1,0x8236,(this->m_imageSize).m_data[0],(this->m_imageSize).m_data[1]);
    (*gl->texParameteri)(0xde1,0x2801,0x2600);
    (*gl->texParameteri)(0xde1,0x2800,0x2600);
    GVar6 = (*gl->getError)();
    glu::checkError(GVar6,"Uploading image data failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                    ,0x4a4);
    (*gl->bindImageTexture)(1,outputTexture.super_ObjectWrapper.m_object,0,'\0',0,0x88b9,0x8236);
    GVar6 = (*gl->getError)();
    glu::checkError(GVar6,"Image setup failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                    ,0x4a8);
    (*gl->dispatchCompute)(workSize.m_data[0],workSize.m_data[1],1);
    GVar6 = (*gl->getError)();
    glu::checkError(GVar6,"glDispatchCompute()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                    ,0x4ac);
    glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
              (&fbo,((this->super_TestCase).m_context)->m_renderCtx);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&pixels,(long)inputValues.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                       (long)inputValues.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start,(allocator_type *)&valueInfo);
    (*gl->bindFramebuffer)(0x8d40,fbo.super_ObjectWrapper.m_object);
    (*gl->framebufferTexture2D)(0x8d40,0x8ce0,0xde1,outputTexture.super_ObjectWrapper.m_object,0);
    GVar6 = (*gl->checkFramebufferStatus)(0x8d40);
    if (GVar6 == 0x8cd5) {
      (*gl->readBuffer)(0x8ce0);
      (*gl->readPixels)(0,0,(this->m_imageSize).m_data[0],(this->m_imageSize).m_data[1],0x8d99,
                        0x1405,pixels.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start);
      GVar6 = (*gl->getError)();
      glu::checkError(GVar6,"Reading pixels failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                      ,0x4ba);
      uVar11 = 0;
      uVar10 = 0;
      do {
        local_4dc = (uint)uVar11;
        if (((ulong)((long)inputValues.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)inputValues.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2 & 0xffffffff) <= uVar11) {
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    (&pixels.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
          glu::ObjectWrapper::~ObjectWrapper(&fbo.super_ObjectWrapper);
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_PASS,"Pass");
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    (&inputValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
          glu::ShaderProgram::~ShaderProgram(&program);
          glu::ObjectWrapper::~ObjectWrapper(&outputTexture.super_ObjectWrapper);
          glu::ObjectWrapper::~ObjectWrapper(&inputBuffer.super_ObjectWrapper);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
          return STOP;
        }
        uVar12 = uVar10 & 0xffffffff;
        uVar11 = uVar11 + 1;
        puVar1 = (uint *)((long)inputValues.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start + uVar10);
        uVar10 = uVar10 + 4;
      } while (pixels.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar12] == *puVar1);
      pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&blockInfo,"Comparison failed for pixel ",&local_4f9);
      de::toString<unsigned_int>((string *)&bufMap,&local_4dc);
      std::operator+(&valueInfo.name,&blockInfo.name,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bufMap);
      tcu::TestError::TestError(pTVar9,&valueInfo.name);
      __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar9,(char *)0x0,
               "gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
               ,0x4b5);
    __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar9,(char *)0x0,"valueInfo.arraySize == (deUint32)inputValues.size()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
             ,0x492);
  __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate (void)
	{
		const GLSLVersion			glslVersion		= glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType());
		std::ostringstream			src;

		src << getGLSLVersionDeclaration(glslVersion) << "\n"
			<< "layout (local_size_x = " << m_localSize[0] << ", local_size_y = " << m_localSize[1] << ") in;\n"
			<< "layout(r32ui, binding = 1) writeonly uniform highp uimage2D u_dstImg;\n"
			<< "buffer Input {\n"
			<< "    uint values[" << (m_imageSize[0]*m_imageSize[1]) << "];\n"
			<< "} sb_in;\n\n"
			<< "void main (void) {\n"
			<< "    uint stride = gl_NumWorkGroups.x*gl_WorkGroupSize.x;\n"
			<< "    uint value  = sb_in.values[gl_GlobalInvocationID.y*stride + gl_GlobalInvocationID.x];\n"
			<< "    imageStore(u_dstImg, ivec2(gl_GlobalInvocationID.xy), uvec4(value, 0, 0, 0));\n"
			<< "}\n";

		const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
		const Buffer				inputBuffer		(m_context.getRenderContext());
		const Texture				outputTexture	(m_context.getRenderContext());
		const ShaderProgram			program			(m_context.getRenderContext(), ProgramSources() << ShaderSource(SHADERTYPE_COMPUTE, src.str()));
		const tcu::IVec2			workSize		= m_imageSize / m_localSize;
		de::Random					rnd				(0x77238ac2);
		vector<deUint32>			inputValues		(m_imageSize[0]*m_imageSize[1]);

		m_testCtx.getLog() << program;
		if (!program.isOk())
			TCU_FAIL("Compile failed");

		m_testCtx.getLog() << TestLog::Message << "Work groups: " << workSize << TestLog::EndMessage;

		gl.useProgram(program.getProgram());

		// Input values
		for (vector<deUint32>::iterator i = inputValues.begin(); i != inputValues.end(); ++i)
			*i = rnd.getUint32();

		// Input buffer setup
		{
			const deUint32				blockIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_SHADER_STORAGE_BLOCK, "Input");
			const InterfaceBlockInfo	blockInfo	= getProgramInterfaceBlockInfo(gl, program.getProgram(), GL_SHADER_STORAGE_BLOCK, blockIndex);
			const deUint32				valueIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_BUFFER_VARIABLE, "Input.values");
			const InterfaceVariableInfo	valueInfo	= getProgramInterfaceVariableInfo(gl, program.getProgram(), GL_BUFFER_VARIABLE, valueIndex);

			gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *inputBuffer);
			gl.bufferData(GL_SHADER_STORAGE_BUFFER, (glw::GLsizeiptr)blockInfo.dataSize, DE_NULL, GL_STATIC_DRAW);

			TCU_CHECK(valueInfo.arraySize == (deUint32)inputValues.size());

			{
				const BufferMemMap bufMap(gl, GL_SHADER_STORAGE_BUFFER, 0, (int)blockInfo.dataSize, GL_MAP_WRITE_BIT);

				for (deUint32 ndx = 0; ndx < (deUint32)inputValues.size(); ndx++)
					*(deUint32*)((deUint8*)bufMap.getPtr() + valueInfo.offset + ndx*valueInfo.arrayStride) = inputValues[ndx];
			}

			gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, blockInfo.bufferBinding, *inputBuffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Input buffer setup failed");
		}

		// Output image setup
		gl.bindTexture(GL_TEXTURE_2D, *outputTexture);
		gl.texStorage2D(GL_TEXTURE_2D, 1, GL_R32UI, m_imageSize[0], m_imageSize[1]);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Uploading image data failed");

		// Bind to unit 1
		gl.bindImageTexture(1, *outputTexture, 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_R32UI);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Image setup failed");

		// Dispatch compute workload
		gl.dispatchCompute(workSize[0], workSize[1], 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute()");

		// Read back and compare
		{
			Framebuffer			fbo			(m_context.getRenderContext());
			vector<deUint32>	pixels		(inputValues.size()*4);

			gl.bindFramebuffer(GL_FRAMEBUFFER, *fbo);
			gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, *outputTexture, 0);
			TCU_CHECK(gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE);

			// \note In ES3 we have to use GL_RGBA_INTEGER
			gl.readBuffer(GL_COLOR_ATTACHMENT0);
			gl.readPixels(0, 0, m_imageSize[0], m_imageSize[1], GL_RGBA_INTEGER, GL_UNSIGNED_INT, &pixels[0]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Reading pixels failed");

			for (deUint32 ndx = 0; ndx < (deUint32)inputValues.size(); ndx++)
			{
				const deUint32	res		= pixels[ndx*4];
				const deUint32	ref		= inputValues[ndx];

				if (res != ref)
					throw tcu::TestError(string("Comparison failed for pixel ") + de::toString(ndx));
			}
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}